

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t writen(int fd,string *sbuff)

{
  ssize_t sVar1;
  int *piVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  int in_EDI;
  char *ptr;
  ssize_t writeSum;
  ssize_t nwriten;
  size_t nleft;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  char *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  size_t local_20;
  undefined4 in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (in_RSI);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1201a8);
  do {
    while ((sVar1 = write(in_EDI,local_38,local_20), 0 < sVar1 || (-1 < sVar1))) {
      local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(local_30->_M_dataplus)._M_p + sVar1);
      local_20 = local_20 - sVar1;
      local_38 = local_38 + sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  piVar2 = __errno_location();
  if (*piVar2 == 0xb) {
    this = local_30;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_RSI);
    if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (long)(int)sVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x120267);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_RSI);
      std::__cxx11::string::~string(this);
    }
    local_8 = local_30;
  }
  else {
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              0xffffffffffffffff;
  }
  return (ssize_t)local_8;
}

Assistant:

ssize_t writen(int fd, std::string &sbuff){
    size_t nleft=sbuff.size();
    ssize_t nwriten=0;
    ssize_t writeSum=0;
    const char* ptr=sbuff.c_str();

    while (true) {
        if((nwriten=write(fd, ptr, nleft))<=0){
            if (nwriten<0) {
                if(errno==EINTR){
                    nwriten=0;
                    continue;
                }else if (errno==EAGAIN) {
                    break;
                }else {
                    return -1;
                }
            }
        }
        writeSum+=nwriten;
        nleft-=nwriten;
        ptr+=nwriten;
    }

    if (writeSum==static_cast<int>(sbuff.size())) {
        sbuff.clear();
    }else {
        sbuff=sbuff.substr(writeSum);
    }
    return writeSum;
}